

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  ErrMsg em;
  ErrMsg in_ESI;
  lua_State *in_RDI;
  int j;
  int i;
  ErrMsg in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  while( true ) {
    if (in_EDX <= (int)in_ESI) {
      return;
    }
    lua_rawgeti(L,l,u);
    lua_rawgeti(L,l,u);
    iVar1 = sort_comp(in_RDI,in_ESI,in_EDX);
    if (iVar1 == 0) {
      lua_settop((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
      iVar1 = in_EDX;
      em = in_ESI;
    }
    else {
      set2((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
      ;
      iVar1 = in_EDX;
      em = in_ESI;
    }
    if (iVar1 - em == 1) break;
    iVar2 = (int)(em + iVar1) / 2;
    lua_rawgeti(L,l,u);
    lua_rawgeti(L,l,u);
    iVar3 = sort_comp(in_RDI,em,iVar1);
    if (iVar3 == 0) {
      lua_settop((lua_State *)CONCAT44(em,iVar1),iVar2);
      lua_rawgeti(L,l,u);
      iVar3 = sort_comp(in_RDI,em,iVar1);
      if (iVar3 == 0) {
        lua_settop((lua_State *)CONCAT44(em,iVar1),iVar2);
      }
      else {
        set2((lua_State *)CONCAT44(em,iVar1),iVar2,in_stack_ffffffffffffffe8);
      }
    }
    else {
      set2((lua_State *)CONCAT44(em,iVar1),iVar2,in_stack_ffffffffffffffe8);
    }
    if (iVar1 - em == 2) {
      return;
    }
    lua_rawgeti(L,l,u);
    lua_pushvalue(_j,(int)((ulong)in_RDI >> 0x20));
    lua_rawgeti(L,l,u);
    set2((lua_State *)CONCAT44(em,iVar1),iVar2,in_stack_ffffffffffffffe8);
    iVar2 = iVar1 + -1;
    in_ESI = em;
    while( true ) {
      while( true ) {
        em = em + 1;
        lua_rawgeti(L,l,u);
        iVar3 = sort_comp(in_RDI,in_ESI,iVar1);
        if (iVar3 == 0) break;
        if (iVar1 <= (int)em) {
          lj_err_caller((lua_State *)CONCAT44(in_ESI,iVar1),em);
        }
        lua_settop((lua_State *)CONCAT44(in_ESI,iVar1),em);
      }
      while( true ) {
        iVar2 = iVar2 + -1;
        lua_rawgeti(L,l,u);
        iVar3 = sort_comp(in_RDI,in_ESI,iVar1);
        if (iVar3 == 0) break;
        if (iVar2 <= (int)in_ESI) {
          lj_err_caller((lua_State *)CONCAT44(in_ESI,iVar1),em);
        }
        lua_settop((lua_State *)CONCAT44(in_ESI,iVar1),em);
      }
      if (iVar2 < (int)em) break;
      set2((lua_State *)CONCAT44(in_ESI,iVar1),em,iVar2);
    }
    lua_settop((lua_State *)CONCAT44(in_ESI,iVar1),em);
    lua_rawgeti(L,l,u);
    lua_rawgeti(L,l,u);
    set2((lua_State *)CONCAT44(in_ESI,iVar1),em,iVar2);
    if ((int)(em - in_ESI) < (int)(iVar1 - em)) {
      in_stack_ffffffffffffffe8 = in_ESI;
      in_stack_ffffffffffffffec = em + ~LJ_ERR_ERRMEM;
      in_EDX = iVar1;
      in_ESI = em + 1;
    }
    else {
      in_stack_ffffffffffffffe8 = em + 1;
      in_EDX = em + ~LJ_ERR_ERRMEM;
      in_stack_ffffffffffffffec = iVar1;
    }
    auxsort((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
           );
  }
  return;
}

Assistant:

static void auxsort(lua_State *L, int l, int u)
{
  while (l < u) {  /* for tail recursion */
    int i, j;
    /* sort elements a[l], a[(l+u)/2] and a[u] */
    lua_rawgeti(L, 1, l);
    lua_rawgeti(L, 1, u);
    if (sort_comp(L, -1, -2))  /* a[u] < a[l]? */
      set2(L, l, u);  /* swap a[l] - a[u] */
    else
      lua_pop(L, 2);
    if (u-l == 1) break;  /* only 2 elements */
    i = (l+u)/2;
    lua_rawgeti(L, 1, i);
    lua_rawgeti(L, 1, l);
    if (sort_comp(L, -2, -1)) {  /* a[i]<a[l]? */
      set2(L, i, l);
    } else {
      lua_pop(L, 1);  /* remove a[l] */
      lua_rawgeti(L, 1, u);
      if (sort_comp(L, -1, -2))  /* a[u]<a[i]? */
	set2(L, i, u);
      else
	lua_pop(L, 2);
    }
    if (u-l == 2) break;  /* only 3 elements */
    lua_rawgeti(L, 1, i);  /* Pivot */
    lua_pushvalue(L, -1);
    lua_rawgeti(L, 1, u-1);
    set2(L, i, u-1);
    /* a[l] <= P == a[u-1] <= a[u], only need to sort from l+1 to u-2 */
    i = l; j = u-1;
    for (;;) {  /* invariant: a[l..i] <= P <= a[j..u] */
      /* repeat ++i until a[i] >= P */
      while (lua_rawgeti(L, 1, ++i), sort_comp(L, -1, -2)) {
	if (i>=u) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[i] */
      }
      /* repeat --j until a[j] <= P */
      while (lua_rawgeti(L, 1, --j), sort_comp(L, -3, -1)) {
	if (j<=l) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[j] */
      }
      if (j<i) {
	lua_pop(L, 3);  /* pop pivot, a[i], a[j] */
	break;
      }
      set2(L, i, j);
    }
    lua_rawgeti(L, 1, u-1);
    lua_rawgeti(L, 1, i);
    set2(L, u-1, i);  /* swap pivot (a[u-1]) with a[i] */
    /* a[l..i-1] <= a[i] == P <= a[i+1..u] */
    /* adjust so that smaller half is in [j..i] and larger one in [l..u] */
    if (i-l < u-i) {
      j=l; i=i-1; l=i+2;
    } else {
      j=i+1; i=u; u=j-2;
    }
    auxsort(L, j, i);  /* call recursively the smaller one */
  }  /* repeat the routine for the larger one */
}